

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItem::ensureVisible(QGraphicsItem *this,QRectF *rect,int xmargin,int ymargin)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  long lVar2;
  QTransform *pQVar3;
  QGraphicsItem **ppQVar4;
  long lVar5;
  long in_FS_OFFSET;
  byte bVar6;
  QGraphicsItem *that;
  QRectF local_a8;
  QGraphicsItem *local_88 [10];
  long local_38;
  
  bVar6 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->scene != (QGraphicsScene *)0x0) {
    local_a8.w = 0.0;
    local_a8.h = 0.0;
    local_a8.xp = 0.0;
    local_a8.yp = 0.0;
    if ((((rect->w != 0.0) || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))) {
      local_88[0] = this_00->q_ptr;
      QGraphicsItemPrivate::ensureSceneTransformRecursive(this_00,local_88);
      pQVar3 = &((this->d_ptr).d)->sceneTransform;
      ppQVar4 = local_88;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ppQVar4 = (QGraphicsItem *)pQVar3->m_matrix[0][0];
        pQVar3 = (QTransform *)((long)pQVar3 + (ulong)bVar6 * -0x10 + 8);
        ppQVar4 = ppQVar4 + (ulong)bVar6 * -2 + 1;
      }
      QTransform::mapRect(&local_a8);
    }
    else {
      sceneBoundingRect(&local_a8,this);
    }
    lVar2 = *(long *)&((this->d_ptr).d)->scene->field_0x8;
    lVar1 = *(long *)(lVar2 + 0x290);
    if (lVar1 != 0) {
      lVar2 = *(long *)(lVar2 + 0x288);
      lVar5 = 0;
      do {
        QGraphicsView::ensureVisible(*(QGraphicsView **)(lVar2 + lVar5),&local_a8,xmargin,ymargin);
        lVar5 = lVar5 + 8;
      } while (lVar1 << 3 != lVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    if (d_ptr->scene) {
        QRectF sceneRect;
        if (!rect.isNull())
            sceneRect = sceneTransform().mapRect(rect);
        else
            sceneRect = sceneBoundingRect();
        for (QGraphicsView *view : std::as_const(d_ptr->scene->d_func()->views))
            view->ensureVisible(sceneRect, xmargin, ymargin);
    }
}